

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

void tinyobj::LoadMtl(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *material_map,
                     vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
                     istream *inStream,string *warning,string *err)

{
  char cVar1;
  byte bVar2;
  pointer pmVar3;
  pointer pmVar4;
  bool bVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  size_t sVar10;
  ostream *poVar11;
  char *pcVar12;
  bool bVar13;
  undefined4 uVar14;
  _Alloc_hider _Var15;
  texture_option_t *texopt;
  string *texname;
  char *pcVar16;
  undefined1 auVar17 [16];
  string linebuf;
  string key;
  string value;
  stringstream sstr;
  stringstream warn_ss;
  undefined1 local_b28 [16];
  string local_b00;
  undefined4 local_adc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  *local_ab8;
  string *local_ab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8;
  undefined1 local_a88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a78;
  int local_a68;
  ios_base local_a08 [264];
  undefined1 local_900 [304];
  string local_7d0;
  string local_7b0;
  texture_option_t local_790;
  texture_option_t local_730;
  texture_option_t local_6d0;
  texture_option_t local_670;
  texture_option_t local_610;
  texture_option_t local_5b0;
  texture_option_t local_550;
  texture_option_t local_4f0;
  float local_490;
  float local_48c;
  float local_488;
  float local_484;
  float local_480;
  float local_47c;
  float local_478;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  texture_option_t local_3d0;
  texture_option_t local_370;
  texture_option_t local_310;
  texture_option_t local_2b0;
  texture_option_t local_250;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  local_1e8 [8];
  _Rb_tree_node_base local_1e0;
  size_t local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_900._0_8_ = local_900 + 0x10;
  local_900._112_8_ = local_900 + 0x80;
  local_900._8_8_ = 0;
  local_900[0x10] = '\0';
  local_900._120_8_ = 0;
  local_900[0x80] = '\0';
  local_900._144_8_ = local_900 + 0xa0;
  local_900._176_8_ = local_900 + 0xc0;
  local_900._152_8_ = 0;
  local_900[0xa0] = '\0';
  local_900._184_8_ = 0;
  local_900[0xc0] = '\0';
  local_900._208_8_ = local_900 + 0xe0;
  local_900._240_8_ = local_900 + 0x100;
  local_900._216_8_ = 0;
  local_900[0xe0] = '\0';
  local_900._248_8_ = 0;
  local_900[0x100] = '\0';
  local_900._272_8_ = local_900 + 0x120;
  local_7d0._M_dataplus._M_p = local_900 + 0x140;
  local_900._280_8_ = 0;
  local_900[0x120] = '\0';
  local_7d0._M_string_length = 0;
  local_7d0.field_2._M_local_buf[0] = '\0';
  local_7b0._M_dataplus._M_p = local_900 + 0x160;
  local_790.colorspace._M_dataplus._M_p = local_900 + 0x1c0;
  local_7b0._M_string_length = 0;
  local_7b0.field_2._M_local_buf[0] = '\0';
  local_790.colorspace._M_string_length = 0;
  local_790.colorspace.field_2._M_local_buf[0] = '\0';
  local_730.colorspace._M_dataplus._M_p = local_900 + 0x220;
  local_6d0.colorspace._M_dataplus._M_p = local_900 + 0x280;
  local_730.colorspace._M_string_length = 0;
  local_730.colorspace.field_2._M_local_buf[0] = '\0';
  local_6d0.colorspace._M_string_length = 0;
  local_6d0.colorspace.field_2._M_local_buf[0] = '\0';
  local_670.colorspace._M_dataplus._M_p = local_900 + 0x2e0;
  local_610.colorspace._M_dataplus._M_p = local_900 + 0x340;
  local_670.colorspace._M_string_length = 0;
  local_670.colorspace.field_2._M_local_buf[0] = '\0';
  local_610.colorspace._M_string_length = 0;
  local_610.colorspace.field_2._M_local_buf[0] = '\0';
  local_5b0.colorspace._M_dataplus._M_p = local_900 + 0x3a0;
  local_550.colorspace._M_dataplus._M_p = local_900 + 0x400;
  local_5b0.colorspace._M_string_length = 0;
  local_5b0.colorspace.field_2._M_local_buf[0] = '\0';
  local_550.colorspace._M_string_length = 0;
  local_550.colorspace.field_2._M_local_buf[0] = '\0';
  local_4f0.colorspace._M_dataplus._M_p = local_900 + 0x460;
  local_470._M_dataplus._M_p = local_900 + 0x4a0;
  local_4f0.colorspace._M_string_length = 0;
  local_4f0.colorspace.field_2._M_local_buf[0] = '\0';
  local_470._M_string_length = 0;
  local_470.field_2._M_local_buf[0] = '\0';
  local_450._M_dataplus._M_p = local_900 + 0x4c0;
  local_430._M_dataplus._M_p = local_900 + 0x4e0;
  local_450._M_string_length = 0;
  local_450.field_2._M_local_buf[0] = '\0';
  local_430._M_string_length = 0;
  local_430.field_2._M_local_buf[0] = '\0';
  local_410._M_dataplus._M_p = local_900 + 0x500;
  local_3f0._M_dataplus._M_p = local_900 + 0x520;
  local_410._M_string_length = 0;
  local_410.field_2._M_local_buf[0] = '\0';
  local_3f0._M_string_length = 0;
  local_3f0.field_2._M_local_buf[0] = '\0';
  local_3d0.colorspace._M_dataplus._M_p = local_900 + 0x580;
  local_370.colorspace._M_dataplus._M_p = local_900 + 0x5e0;
  local_3d0.colorspace._M_string_length = 0;
  local_3d0.colorspace.field_2._M_local_buf[0] = '\0';
  local_370.colorspace._M_string_length = 0;
  local_370.colorspace.field_2._M_local_buf[0] = '\0';
  local_310.colorspace._M_dataplus._M_p = local_900 + 0x640;
  local_2b0.colorspace._M_dataplus._M_p = local_900 + 0x6a0;
  local_310.colorspace._M_string_length = 0;
  local_310.colorspace.field_2._M_local_buf[0] = '\0';
  local_2b0.colorspace._M_string_length = 0;
  local_2b0.colorspace.field_2._M_local_buf[0] = '\0';
  local_250.colorspace._M_dataplus._M_p = local_900 + 0x700;
  local_1e0._M_left = &local_1e0;
  local_250.colorspace._M_string_length = 0;
  local_250.colorspace.field_2._M_local_buf[0] = '\0';
  local_1e0._M_color = _S_red;
  local_1e0._M_parent = (_Base_ptr)0x0;
  local_1c0 = 0;
  local_ab8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
               *)material_map;
  local_ab0 = warning;
  local_1e0._M_right = local_1e0._M_left;
  InitMaterial((material_t *)local_900);
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_b00._M_dataplus._M_p = (pointer)&local_b00.field_2;
  bVar7 = false;
  local_b00._M_string_length = 0;
  local_b00.field_2._M_local_buf[0] = '\0';
LAB_009448e2:
  bVar13 = false;
LAB_009448ea:
  bVar8 = false;
LAB_009448f2:
  do {
    do {
      iVar9 = std::istream::peek();
      if (iVar9 == -1) {
        pmVar3 = (materials->
                 super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pmVar4 = (materials->
                 super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        local_a88._0_8_ = local_a88 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a88,local_900._0_8_,(char *)(local_900._0_8_ + local_900._8_8_));
        local_a68 = (int)((ulong)((long)pmVar4 - (long)pmVar3) >> 3) * 0x1fdcd759;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                  (local_ab8,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                    *)local_a88);
        if ((undefined1 *)local_a88._0_8_ != local_a88 + 0x10) {
          operator_delete((void *)local_a88._0_8_,local_a78._M_allocated_capacity + 1);
        }
        std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::push_back
                  (materials,(value_type *)local_900);
        if (local_ab0 != (string *)0x0) {
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)local_ab0,(string *)local_a88);
          if ((undefined1 *)local_a88._0_8_ != local_a88 + 0x10) {
            operator_delete((void *)local_a88._0_8_,local_a78._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b00._M_dataplus._M_p != &local_b00.field_2) {
          operator_delete(local_b00._M_dataplus._M_p,
                          CONCAT71(local_b00.field_2._M_allocated_capacity._1_7_,
                                   local_b00.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        material_t::~material_t((material_t *)local_900);
        return;
      }
      safeGetline(inStream,&local_b00);
    } while (local_b00._M_string_length == 0);
    std::__cxx11::string::find_last_not_of((char *)&local_b00,0x9df2ac,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)local_a88,(ulong)&local_b00);
    std::__cxx11::string::operator=((string *)&local_b00,(string *)local_a88);
    if ((undefined1 *)local_a88._0_8_ != local_a88 + 0x10) {
      operator_delete((void *)local_a88._0_8_,local_a78._M_allocated_capacity + 1);
    }
    _Var6._M_p = local_b00._M_dataplus._M_p;
  } while (local_b00._M_string_length == 0);
  if (local_b00._M_dataplus._M_p[local_b00._M_string_length - 1] == '\n') goto code_r0x0094498b;
  goto LAB_009449a5;
code_r0x0094498b:
  local_b00._M_string_length = local_b00._M_string_length - 1;
  local_b00._M_dataplus._M_p[local_b00._M_string_length] = '\0';
  if (local_b00._M_string_length == 0) goto LAB_009448f2;
LAB_009449a5:
  _Var15._M_p = local_b00._M_dataplus._M_p;
  if (local_b00._M_dataplus._M_p[local_b00._M_string_length - 1] == '\r') {
    local_b00._M_string_length = local_b00._M_string_length - 1;
    local_b00._M_dataplus._M_p[local_b00._M_string_length] = '\0';
    if (local_b00._M_string_length == 0) goto LAB_009448f2;
    sVar10 = strspn(local_b00._M_dataplus._M_p," \t");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      __assert_fail("token",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/tinyobjloader/tiny_obj_loader.h"
                    ,0x6b3,
                    "void tinyobj::LoadMtl(std::map<std::string, int> *, std::vector<material_t> *, std::istream *, std::string *, std::string *)"
                   );
    }
  }
  else {
    sVar10 = strspn(local_b00._M_dataplus._M_p," \t");
  }
  pcVar16 = _Var6._M_p + sVar10;
  cVar1 = *pcVar16;
  if ((cVar1 == '\0') || (cVar1 == '#')) goto LAB_009448f2;
  iVar9 = strncmp(pcVar16,"newmtl",6);
  if ((iVar9 == 0) && ((pcVar16[6] == ' ' || (pcVar16[6] == '\t')))) {
    if (local_900._8_8_ != 0) {
      pmVar3 = (materials->
               super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pmVar4 = (materials->
               super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      local_a88._0_8_ = local_a88 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a88,local_900._0_8_,(char *)(local_900._0_8_ + local_900._8_8_));
      local_a68 = (int)((ulong)((long)pmVar4 - (long)pmVar3) >> 3) * 0x1fdcd759;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                (local_ab8,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  *)local_a88);
      if ((undefined1 *)local_a88._0_8_ != local_a88 + 0x10) {
        operator_delete((void *)local_a88._0_8_,local_a78._M_allocated_capacity + 1);
      }
      std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::push_back
                (materials,(value_type *)local_900);
    }
    InitMaterial((material_t *)local_900);
    std::__cxx11::stringstream::stringstream((stringstream *)local_a88);
    sVar10 = strlen(pcVar16 + 7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a88 + 0x10),pcVar16 + 7,sVar10);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_900,(string *)&local_ad8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
      operator_delete(local_ad8._M_dataplus._M_p,local_ad8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_a88);
    std::ios_base::~ios_base(local_a08);
    goto LAB_009448e2;
  }
  if (cVar1 == 'T') {
    uVar14 = (undefined4)CONCAT71((int7)((ulong)_Var15._M_p >> 8),1);
    if ((pcVar16[1] == 'f') && ((pcVar16[2] == ' ' || (pcVar16[2] == '\t')))) {
LAB_00944b5d:
      sVar10 = strspn(pcVar16 + 2," \t");
      pcVar16 = pcVar16 + sVar10 + 2;
      sVar10 = strcspn(pcVar16," \t\r");
      pcVar12 = pcVar16 + sVar10;
      local_a88._0_8_ = (pointer)0x0;
      tryParseDouble(pcVar16,pcVar12,(double *)local_a88);
      local_b28._8_8_ = 0;
      local_b28._0_8_ = local_a88._0_8_;
      sVar10 = strspn(pcVar12," \t");
      pcVar12 = pcVar12 + sVar10;
      sVar10 = strcspn(pcVar12," \t\r");
      pcVar16 = pcVar12 + sVar10;
      local_a88._0_8_ = (pointer)0x0;
      tryParseDouble(pcVar12,pcVar16,(double *)local_a88);
      auVar17 = vmovhps_avx(local_b28,local_a88._0_8_);
      sVar10 = strspn(pcVar16," \t");
      pcVar16 = pcVar16 + sVar10;
      sVar10 = strcspn(pcVar16," \t\r");
      local_a88._0_8_ = (pointer)0x0;
      tryParseDouble(pcVar16,pcVar16 + sVar10,(double *)local_a88);
      auVar17 = vcvtpd2ps_avx(auVar17);
      local_900._76_4_ = (undefined4)(double)local_a88._0_8_;
      local_900._68_8_ = vmovlps_avx(auVar17);
      goto LAB_009448f2;
    }
  }
  else {
    if (cVar1 == 'N') {
      if (pcVar16[1] == 's') {
        if ((pcVar16[2] == ' ') || (pcVar16[2] == '\t')) {
          sVar10 = strspn(pcVar16 + 2," \t");
          pcVar16 = pcVar16 + 2 + sVar10;
          sVar10 = strcspn(pcVar16," \t\r");
          local_a88._0_8_ = (pointer)0x0;
          tryParseDouble(pcVar16,pcVar16 + sVar10,(double *)local_a88);
          local_900._92_4_ = (undefined4)(double)local_a88._0_8_;
          goto LAB_009448f2;
        }
      }
      else if ((pcVar16[1] == 'i') && ((pcVar16[2] == ' ' || (pcVar16[2] == '\t')))) {
        sVar10 = strspn(pcVar16 + 2," \t");
        pcVar16 = pcVar16 + 2 + sVar10;
        sVar10 = strcspn(pcVar16," \t\r");
        local_a88._0_8_ = (pointer)0x0;
        tryParseDouble(pcVar16,pcVar16 + sVar10,(double *)local_a88);
        local_900._96_4_ = (undefined4)(double)local_a88._0_8_;
        goto LAB_009448f2;
      }
    }
    else if (cVar1 == 'K') {
      bVar2 = pcVar16[1];
      uVar14 = 0;
      if (bVar2 < 0x65) {
        if (bVar2 == 0x61) {
          if ((pcVar16[2] == ' ') || (pcVar16[2] == '\t')) {
            sVar10 = strspn(pcVar16 + 2," \t");
            pcVar12 = pcVar16 + 2 + sVar10;
            sVar10 = strcspn(pcVar12," \t\r");
            pcVar16 = pcVar12 + sVar10;
            local_a88._0_8_ = (pointer)0x0;
            tryParseDouble(pcVar12,pcVar16,(double *)local_a88);
            local_b28._8_8_ = 0;
            local_b28._0_8_ = local_a88._0_8_;
            sVar10 = strspn(pcVar16," \t");
            pcVar16 = pcVar16 + sVar10;
            sVar10 = strcspn(pcVar16," \t\r");
            pcVar12 = pcVar16 + sVar10;
            local_a88._0_8_ = (pointer)0x0;
            tryParseDouble(pcVar16,pcVar12,(double *)local_a88);
            auVar17 = vmovhps_avx(local_b28,local_a88._0_8_);
            sVar10 = strspn(pcVar12," \t");
            pcVar12 = pcVar12 + sVar10;
            sVar10 = strcspn(pcVar12," \t\r");
            local_a88._0_8_ = (pointer)0x0;
            tryParseDouble(pcVar12,pcVar12 + sVar10,(double *)local_a88);
            auVar17 = vcvtpd2ps_avx(auVar17);
            local_900._40_4_ = (undefined4)(double)local_a88._0_8_;
            local_900._32_8_ = vmovlps_avx(auVar17);
            goto LAB_009448f2;
          }
        }
        else {
          if (bVar2 != 100) goto LAB_0094510f;
          if ((pcVar16[2] == ' ') || (pcVar16[2] == '\t')) {
            sVar10 = strspn(pcVar16 + 2," \t");
            pcVar12 = pcVar16 + 2 + sVar10;
            sVar10 = strcspn(pcVar12," \t\r");
            pcVar16 = pcVar12 + sVar10;
            local_a88._0_8_ = (pointer)0x0;
            tryParseDouble(pcVar12,pcVar16,(double *)local_a88);
            local_b28._8_8_ = 0;
            local_b28._0_8_ = local_a88._0_8_;
            sVar10 = strspn(pcVar16," \t");
            pcVar16 = pcVar16 + sVar10;
            sVar10 = strcspn(pcVar16," \t\r");
            pcVar12 = pcVar16 + sVar10;
            local_a88._0_8_ = (pointer)0x0;
            tryParseDouble(pcVar16,pcVar12,(double *)local_a88);
            auVar17 = vmovhps_avx(local_b28,local_a88._0_8_);
            sVar10 = strspn(pcVar12," \t");
            pcVar12 = pcVar12 + sVar10;
            sVar10 = strcspn(pcVar12," \t\r");
            local_a88._0_8_ = (pointer)0x0;
            tryParseDouble(pcVar12,pcVar12 + sVar10,(double *)local_a88);
            auVar17 = vcvtpd2ps_avx(auVar17);
            local_900._52_4_ = (undefined4)(double)local_a88._0_8_;
            bVar7 = true;
            local_900._44_8_ = vmovlps_avx(auVar17);
            goto LAB_009448f2;
          }
        }
      }
      else if (bVar2 == 0x65) {
        if ((pcVar16[2] == ' ') || (pcVar16[2] == '\t')) {
          sVar10 = strspn(pcVar16 + 2," \t");
          pcVar12 = pcVar16 + 2 + sVar10;
          sVar10 = strcspn(pcVar12," \t\r");
          pcVar16 = pcVar12 + sVar10;
          local_a88._0_8_ = (pointer)0x0;
          tryParseDouble(pcVar12,pcVar16,(double *)local_a88);
          local_b28._8_8_ = 0;
          local_b28._0_8_ = local_a88._0_8_;
          sVar10 = strspn(pcVar16," \t");
          pcVar16 = pcVar16 + sVar10;
          sVar10 = strcspn(pcVar16," \t\r");
          pcVar12 = pcVar16 + sVar10;
          local_a88._0_8_ = (pointer)0x0;
          tryParseDouble(pcVar16,pcVar12,(double *)local_a88);
          auVar17 = vmovhps_avx(local_b28,local_a88._0_8_);
          sVar10 = strspn(pcVar12," \t");
          pcVar12 = pcVar12 + sVar10;
          sVar10 = strcspn(pcVar12," \t\r");
          local_a88._0_8_ = (pointer)0x0;
          tryParseDouble(pcVar12,pcVar12 + sVar10,(double *)local_a88);
          auVar17 = vcvtpd2ps_avx(auVar17);
          local_900._88_4_ = (undefined4)(double)local_a88._0_8_;
          local_900._80_8_ = vmovlps_avx(auVar17);
          goto LAB_009448f2;
        }
      }
      else if (bVar2 == 0x73) {
        if ((pcVar16[2] == ' ') || (pcVar16[2] == '\t')) {
          sVar10 = strspn(pcVar16 + 2," \t");
          pcVar12 = pcVar16 + 2 + sVar10;
          sVar10 = strcspn(pcVar12," \t\r");
          pcVar16 = pcVar12 + sVar10;
          local_a88._0_8_ = (pointer)0x0;
          tryParseDouble(pcVar12,pcVar16,(double *)local_a88);
          local_b28._8_8_ = 0;
          local_b28._0_8_ = local_a88._0_8_;
          sVar10 = strspn(pcVar16," \t");
          pcVar16 = pcVar16 + sVar10;
          sVar10 = strcspn(pcVar16," \t\r");
          pcVar12 = pcVar16 + sVar10;
          local_a88._0_8_ = (pointer)0x0;
          tryParseDouble(pcVar16,pcVar12,(double *)local_a88);
          auVar17 = vmovhps_avx(local_b28,local_a88._0_8_);
          sVar10 = strspn(pcVar12," \t");
          pcVar12 = pcVar12 + sVar10;
          sVar10 = strcspn(pcVar12," \t\r");
          local_a88._0_8_ = (pointer)0x0;
          tryParseDouble(pcVar12,pcVar12 + sVar10,(double *)local_a88);
          auVar17 = vcvtpd2ps_avx(auVar17);
          local_900._64_4_ = (undefined4)(double)local_a88._0_8_;
          local_900._56_8_ = vmovlps_avx(auVar17);
          goto LAB_009448f2;
        }
      }
      else {
        if (bVar2 != 0x74) goto LAB_0094510f;
        if ((pcVar16[2] == '\t') || (pcVar16[2] == ' ')) goto LAB_00944b5d;
      }
    }
    uVar14 = 0;
  }
LAB_0094510f:
  local_adc = uVar14;
  iVar9 = strncmp(pcVar16,"illum",5);
  if ((iVar9 == 0) && ((pcVar16[5] == ' ' || (pcVar16[5] == '\t')))) {
    sVar10 = strspn(pcVar16 + 6," \t");
    local_900._104_4_ = atoi(pcVar16 + sVar10 + 6);
    goto LAB_009448f2;
  }
  if ((cVar1 == 'd') && ((pcVar16[1] == ' ' || (pcVar16[1] == '\t')))) {
    sVar10 = strspn(pcVar16 + 1," \t");
    pcVar16 = pcVar16 + 1 + sVar10;
    sVar10 = strcspn(pcVar16," \t\r");
    local_a88._0_8_ = (pointer)0x0;
    tryParseDouble(pcVar16,pcVar16 + sVar10,(double *)local_a88);
    local_900._100_4_ = (undefined4)(double)local_a88._0_8_;
    bVar5 = !bVar13;
    bVar13 = false;
    bVar8 = true;
    if (bVar5) goto LAB_009448f2;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Both `d` and `Tr` parameters defined for \"",0x2a);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,(char *)local_900._0_8_,local_900._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"\". Use the value of `d` for dissolve (line ",0x2b);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," in .mtl.)",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  }
  else {
    if ((((char)local_adc == '\0') || (pcVar16[1] != 'r')) ||
       ((pcVar16[2] != ' ' && (pcVar16[2] != '\t')))) {
      if (cVar1 == 'P') {
        bVar2 = pcVar16[1];
        if (bVar2 < 0x72) {
          if (bVar2 == 99) {
            if ((pcVar16[2] == ' ') || (pcVar16[2] == '\t')) {
              sVar10 = strspn(pcVar16 + 2," \t");
              pcVar16 = pcVar16 + 2 + sVar10;
              sVar10 = strcspn(pcVar16," \t\r");
              local_a88._0_8_ = (pointer)0x0;
              tryParseDouble(pcVar16,pcVar16 + sVar10,(double *)local_a88);
              local_484 = (float)(double)local_a88._0_8_;
              goto LAB_009448f2;
            }
          }
          else if ((bVar2 == 0x6d) && ((pcVar16[2] == ' ' || (pcVar16[2] == '\t')))) {
            sVar10 = strspn(pcVar16 + 2," \t");
            pcVar16 = pcVar16 + 2 + sVar10;
            sVar10 = strcspn(pcVar16," \t\r");
            local_a88._0_8_ = (pointer)0x0;
            tryParseDouble(pcVar16,pcVar16 + sVar10,(double *)local_a88);
            local_48c = (float)(double)local_a88._0_8_;
            goto LAB_009448f2;
          }
        }
        else if (bVar2 == 0x73) {
          if ((pcVar16[2] == ' ') || (pcVar16[2] == '\t')) {
            sVar10 = strspn(pcVar16 + 2," \t");
            pcVar16 = pcVar16 + 2 + sVar10;
            sVar10 = strcspn(pcVar16," \t\r");
            local_a88._0_8_ = (pointer)0x0;
            tryParseDouble(pcVar16,pcVar16 + sVar10,(double *)local_a88);
            local_488 = (float)(double)local_a88._0_8_;
            goto LAB_009448f2;
          }
        }
        else if ((bVar2 == 0x72) && ((pcVar16[2] == ' ' || (pcVar16[2] == '\t')))) {
          sVar10 = strspn(pcVar16 + 2," \t");
          pcVar16 = pcVar16 + 2 + sVar10;
          sVar10 = strcspn(pcVar16," \t\r");
          local_a88._0_8_ = (pointer)0x0;
          tryParseDouble(pcVar16,pcVar16 + sVar10,(double *)local_a88);
          local_490 = (float)(double)local_a88._0_8_;
          goto LAB_009448f2;
        }
        if (((pcVar16[1] == 'c') && (pcVar16[2] == 'r')) &&
           ((pcVar16[3] == ' ' || (pcVar16[3] == '\t')))) {
          sVar10 = strspn(pcVar16 + 4," \t");
          pcVar16 = pcVar16 + sVar10 + 4;
          sVar10 = strcspn(pcVar16," \t\r");
          local_a88._0_8_ = (pointer)0x0;
          tryParseDouble(pcVar16,pcVar16 + sVar10,(double *)local_a88);
          local_480 = (float)(double)local_a88._0_8_;
          goto LAB_009448f2;
        }
      }
      iVar9 = strncmp(pcVar16,"aniso",5);
      if ((iVar9 == 0) && ((pcVar16[5] == ' ' || (pcVar16[5] == '\t')))) {
        sVar10 = strspn(pcVar16 + 6," \t");
        pcVar16 = pcVar16 + sVar10 + 6;
        sVar10 = strcspn(pcVar16," \t\r");
        local_a88._0_8_ = (pointer)0x0;
        tryParseDouble(pcVar16,pcVar16 + sVar10,(double *)local_a88);
        local_47c = (float)(double)local_a88._0_8_;
        goto LAB_009448f2;
      }
      iVar9 = strncmp(pcVar16,"anisor",6);
      if ((iVar9 == 0) && ((pcVar16[6] == ' ' || (pcVar16[6] == '\t')))) {
        sVar10 = strspn(pcVar16 + 7," \t");
        pcVar16 = pcVar16 + sVar10 + 7;
        sVar10 = strcspn(pcVar16," \t\r");
        local_a88._0_8_ = (pointer)0x0;
        tryParseDouble(pcVar16,pcVar16 + sVar10,(double *)local_a88);
        local_478 = (float)(double)local_a88._0_8_;
        goto LAB_009448f2;
      }
      iVar9 = strncmp(pcVar16,"map_Ka",6);
      if ((iVar9 == 0) && ((pcVar16[6] == ' ' || (pcVar16[6] == '\t')))) {
        pcVar16 = pcVar16 + 7;
        texname = (string *)(local_900 + 0x70);
        texopt = (texture_option_t *)(local_900 + 0x170);
      }
      else {
        iVar9 = strncmp(pcVar16,"map_Kd",6);
        if ((iVar9 == 0) && ((pcVar16[6] == ' ' || (pcVar16[6] == '\t')))) {
          ParseTextureNameAndOption
                    ((string *)(local_900 + 0x90),(texture_option_t *)(local_900 + 0x1d0),
                     pcVar16 + 7);
          bVar5 = !bVar7;
          bVar7 = true;
          if (bVar5) {
            auVar17._8_4_ = 0x3f19999a;
            auVar17._0_8_ = 0x3f19999a3f19999a;
            auVar17._12_4_ = 0x3f19999a;
            bVar7 = false;
            local_900._44_8_ = vmovlps_avx(auVar17);
            local_900._52_4_ = 0.6;
          }
          goto LAB_009448f2;
        }
        iVar9 = strncmp(pcVar16,"map_Ks",6);
        if ((iVar9 == 0) && ((pcVar16[6] == ' ' || (pcVar16[6] == '\t')))) {
          pcVar16 = pcVar16 + 7;
          texname = (string *)(local_900 + 0xb0);
          texopt = (texture_option_t *)(local_900 + 0x230);
        }
        else {
          iVar9 = strncmp(pcVar16,"map_Ns",6);
          if ((iVar9 == 0) && ((pcVar16[6] == ' ' || (pcVar16[6] == '\t')))) {
            pcVar16 = pcVar16 + 7;
            texname = (string *)(local_900 + 0xd0);
            texopt = (texture_option_t *)(local_900 + 0x290);
          }
          else {
            iVar9 = strncmp(pcVar16,"map_bump",8);
            if (((iVar9 == 0) && ((pcVar16[8] == ' ' || (pcVar16[8] == '\t')))) ||
               ((iVar9 = strncmp(pcVar16,"map_Bump",8), iVar9 == 0 &&
                ((pcVar16[8] == ' ' || (pcVar16[8] == '\t')))))) {
              pcVar16 = pcVar16 + 9;
            }
            else {
              iVar9 = strncmp(pcVar16,"bump",4);
              if ((iVar9 != 0) || ((pcVar16[4] != ' ' && (pcVar16[4] != '\t')))) {
                iVar9 = strncmp(pcVar16,"map_d",5);
                if ((iVar9 == 0) && ((pcVar16[5] == ' ' || (pcVar16[5] == '\t')))) {
                  pcVar16 = pcVar16 + 6;
                  std::__cxx11::string::operator=((string *)(local_900 + 0x130),pcVar16);
                  texname = (string *)(local_900 + 0x130);
                  texopt = (texture_option_t *)(local_900 + 0x3b0);
                }
                else {
                  iVar9 = strncmp(pcVar16,"disp",4);
                  if ((iVar9 == 0) && ((pcVar16[4] == ' ' || (pcVar16[4] == '\t')))) {
                    pcVar16 = pcVar16 + 5;
                    texname = (string *)(local_900 + 0x110);
                    texopt = (texture_option_t *)(local_900 + 0x350);
                  }
                  else {
                    iVar9 = strncmp(pcVar16,"refl",4);
                    if ((iVar9 == 0) && ((pcVar16[4] == ' ' || (pcVar16[4] == '\t')))) {
                      pcVar16 = pcVar16 + 5;
                      texname = (string *)(local_900 + 0x150);
                      texopt = (texture_option_t *)(local_900 + 0x410);
                    }
                    else {
                      iVar9 = strncmp(pcVar16,"map_Pr",6);
                      if ((iVar9 == 0) && ((pcVar16[6] == ' ' || (pcVar16[6] == '\t')))) {
                        pcVar16 = pcVar16 + 7;
                        texname = (string *)(local_900 + 0x490);
                        texopt = (texture_option_t *)(local_900 + 0x530);
                      }
                      else {
                        iVar9 = strncmp(pcVar16,"map_Pm",6);
                        if ((iVar9 == 0) && ((pcVar16[6] == ' ' || (pcVar16[6] == '\t')))) {
                          pcVar16 = pcVar16 + 7;
                          texname = (string *)(local_900 + 0x4b0);
                          texopt = (texture_option_t *)(local_900 + 0x590);
                        }
                        else {
                          iVar9 = strncmp(pcVar16,"map_Ps",6);
                          if ((iVar9 == 0) && ((pcVar16[6] == ' ' || (pcVar16[6] == '\t')))) {
                            pcVar16 = pcVar16 + 7;
                            texname = (string *)(local_900 + 0x4d0);
                            texopt = (texture_option_t *)(local_900 + 0x5f0);
                          }
                          else {
                            iVar9 = strncmp(pcVar16,"map_Ke",6);
                            if ((iVar9 == 0) && ((pcVar16[6] == ' ' || (pcVar16[6] == '\t')))) {
                              pcVar16 = pcVar16 + 7;
                              texname = (string *)(local_900 + 0x4f0);
                              texopt = (texture_option_t *)(local_900 + 0x650);
                            }
                            else {
                              iVar9 = strncmp(pcVar16,"norm",4);
                              if ((iVar9 != 0) || ((pcVar16[4] != ' ' && (pcVar16[4] != '\t')))) {
                                pcVar12 = strchr(pcVar16,0x20);
                                if ((pcVar12 != (char *)0x0) ||
                                   (pcVar12 = strchr(pcVar16,9), pcVar12 != (char *)0x0)) {
                                  local_ad8._M_dataplus._M_p = (pointer)&local_ad8.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_ad8,pcVar16,pcVar12);
                                  local_aa8._M_dataplus._M_p = (pointer)&local_aa8.field_2;
                                  sVar10 = strlen(pcVar12 + 1);
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_aa8,pcVar12 + 1,pcVar12 + sVar10 + 1);
                                  std::
                                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::
                                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                                            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)local_a88,&local_ad8,&local_aa8);
                                  std::
                                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                  ::
                                  _M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                              *)(local_900 + 0x718),
                                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)local_a88);
                                  std::
                                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)local_a88);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
                                    operator_delete(local_aa8._M_dataplus._M_p,
                                                    local_aa8.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
                                    operator_delete(local_ad8._M_dataplus._M_p,
                                                    local_ad8.field_2._M_allocated_capacity + 1);
                                  }
                                }
                                goto LAB_009448f2;
                              }
                              pcVar16 = pcVar16 + 5;
                              texname = (string *)(local_900 + 0x510);
                              texopt = (texture_option_t *)(local_900 + 0x6b0);
                            }
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_00945a78;
              }
              pcVar16 = pcVar16 + 5;
            }
            texname = (string *)(local_900 + 0xf0);
            texopt = (texture_option_t *)(local_900 + 0x2f0);
          }
        }
      }
LAB_00945a78:
      ParseTextureNameAndOption(texname,texopt,pcVar16);
      goto LAB_009448f2;
    }
    if (!bVar8) goto LAB_00945bef;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Both `d` and `Tr` parameters defined for \"",0x2a);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,(char *)local_900._0_8_,local_900._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"\". Use the value of `d` for dissolve (line ",0x2b);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," in .mtl.)",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  }
  std::ostream::put((char)poVar11);
  bVar13 = true;
  std::ostream::flush();
  bVar8 = true;
  goto LAB_009448f2;
LAB_00945bef:
  sVar10 = strspn(pcVar16 + 2," \t");
  pcVar16 = pcVar16 + 2 + sVar10;
  sVar10 = strcspn(pcVar16," \t\r");
  local_a88._0_8_ = (pointer)0x0;
  tryParseDouble(pcVar16,pcVar16 + sVar10,(double *)local_a88);
  bVar13 = true;
  local_900._100_4_ = 1.0 - (float)(double)local_a88._0_8_;
  goto LAB_009448ea;
}

Assistant:

void LoadMtl(std::map<std::string, int> *material_map,
             std::vector<material_t> *materials, std::istream *inStream,
             std::string *warning, std::string *err) {
  (void)err;

  // Create a default material anyway.
  material_t material;
  InitMaterial(&material);

  // Issue 43. `d` wins against `Tr` since `Tr` is not in the MTL specification.
  bool has_d = false;
  bool has_tr = false;

  // has_kd is used to set a default diffuse value when map_Kd is present
  // and Kd is not.
  bool has_kd = false;

  std::stringstream warn_ss;

  size_t line_no = 0;
  std::string linebuf;
  while (inStream->peek() != -1) {
    safeGetline(*inStream, linebuf);
    line_no++;

    // Trim trailing whitespace.
    if (linebuf.size() > 0) {
      linebuf = linebuf.substr(0, linebuf.find_last_not_of(" \t") + 1);
    }

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // new mtl
    if ((0 == strncmp(token, "newmtl", 6)) && IS_SPACE((token[6]))) {
      // flush previous material.
      if (!material.name.empty()) {
        material_map->insert(std::pair<std::string, int>(
            material.name, static_cast<int>(materials->size())));
        materials->push_back(material);
      }

      // initial temporary material
      InitMaterial(&material);

      has_d = false;
      has_tr = false;

      // set new mtl name
      token += 7;
      {
        std::stringstream sstr;
        sstr << token;
        material.name = sstr.str();
      }
      continue;
    }

    // ambient
    if (token[0] == 'K' && token[1] == 'a' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.ambient[0] = r;
      material.ambient[1] = g;
      material.ambient[2] = b;
      continue;
    }

    // diffuse
    if (token[0] == 'K' && token[1] == 'd' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.diffuse[0] = r;
      material.diffuse[1] = g;
      material.diffuse[2] = b;
      has_kd = true;
      continue;
    }

    // specular
    if (token[0] == 'K' && token[1] == 's' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.specular[0] = r;
      material.specular[1] = g;
      material.specular[2] = b;
      continue;
    }

    // transmittance
    if ((token[0] == 'K' && token[1] == 't' && IS_SPACE((token[2]))) ||
        (token[0] == 'T' && token[1] == 'f' && IS_SPACE((token[2])))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.transmittance[0] = r;
      material.transmittance[1] = g;
      material.transmittance[2] = b;
      continue;
    }

    // ior(index of refraction)
    if (token[0] == 'N' && token[1] == 'i' && IS_SPACE((token[2]))) {
      token += 2;
      material.ior = parseReal(&token);
      continue;
    }

    // emission
    if (token[0] == 'K' && token[1] == 'e' && IS_SPACE(token[2])) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.emission[0] = r;
      material.emission[1] = g;
      material.emission[2] = b;
      continue;
    }

    // shininess
    if (token[0] == 'N' && token[1] == 's' && IS_SPACE(token[2])) {
      token += 2;
      material.shininess = parseReal(&token);
      continue;
    }

    // illum model
    if (0 == strncmp(token, "illum", 5) && IS_SPACE(token[5])) {
      token += 6;
      material.illum = parseInt(&token);
      continue;
    }

    // dissolve
    if ((token[0] == 'd' && IS_SPACE(token[1]))) {
      token += 1;
      material.dissolve = parseReal(&token);

      if (has_tr) {
        warn_ss << "Both `d` and `Tr` parameters defined for \""
                << material.name
                << "\". Use the value of `d` for dissolve (line " << line_no
                << " in .mtl.)" << std::endl;
      }
      has_d = true;
      continue;
    }
    if (token[0] == 'T' && token[1] == 'r' && IS_SPACE(token[2])) {
      token += 2;
      if (has_d) {
        // `d` wins. Ignore `Tr` value.
        warn_ss << "Both `d` and `Tr` parameters defined for \""
                << material.name
                << "\". Use the value of `d` for dissolve (line " << line_no
                << " in .mtl.)" << std::endl;
      } else {
        // We invert value of Tr(assume Tr is in range [0, 1])
        // NOTE: Interpretation of Tr is application(exporter) dependent. For
        // some application(e.g. 3ds max obj exporter), Tr = d(Issue 43)
        material.dissolve = static_cast<real_t>(1.0) - parseReal(&token);
      }
      has_tr = true;
      continue;
    }

    // PBR: roughness
    if (token[0] == 'P' && token[1] == 'r' && IS_SPACE(token[2])) {
      token += 2;
      material.roughness = parseReal(&token);
      continue;
    }

    // PBR: metallic
    if (token[0] == 'P' && token[1] == 'm' && IS_SPACE(token[2])) {
      token += 2;
      material.metallic = parseReal(&token);
      continue;
    }

    // PBR: sheen
    if (token[0] == 'P' && token[1] == 's' && IS_SPACE(token[2])) {
      token += 2;
      material.sheen = parseReal(&token);
      continue;
    }

    // PBR: clearcoat thickness
    if (token[0] == 'P' && token[1] == 'c' && IS_SPACE(token[2])) {
      token += 2;
      material.clearcoat_thickness = parseReal(&token);
      continue;
    }

    // PBR: clearcoat roughness
    if ((0 == strncmp(token, "Pcr", 3)) && IS_SPACE(token[3])) {
      token += 4;
      material.clearcoat_roughness = parseReal(&token);
      continue;
    }

    // PBR: anisotropy
    if ((0 == strncmp(token, "aniso", 5)) && IS_SPACE(token[5])) {
      token += 6;
      material.anisotropy = parseReal(&token);
      continue;
    }

    // PBR: anisotropy rotation
    if ((0 == strncmp(token, "anisor", 6)) && IS_SPACE(token[6])) {
      token += 7;
      material.anisotropy_rotation = parseReal(&token);
      continue;
    }

    // ambient texture
    if ((0 == strncmp(token, "map_Ka", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.ambient_texname),
                                &(material.ambient_texopt), token);
      continue;
    }

    // diffuse texture
    if ((0 == strncmp(token, "map_Kd", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.diffuse_texname),
                                &(material.diffuse_texopt), token);

      // Set a decent diffuse default value if a diffuse texture is specified
      // without a matching Kd value.
      if (!has_kd)
      {
        material.diffuse[0] = static_cast<real_t>(0.6);
        material.diffuse[1] = static_cast<real_t>(0.6);
        material.diffuse[2] = static_cast<real_t>(0.6);
      }

      continue;
    }

    // specular texture
    if ((0 == strncmp(token, "map_Ks", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.specular_texname),
                                &(material.specular_texopt), token);
      continue;
    }

    // specular highlight texture
    if ((0 == strncmp(token, "map_Ns", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.specular_highlight_texname),
                                &(material.specular_highlight_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "map_bump", 8)) && IS_SPACE(token[8])) {
      token += 9;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "map_Bump", 8)) && IS_SPACE(token[8])) {
      token += 9;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "bump", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // alpha texture
    if ((0 == strncmp(token, "map_d", 5)) && IS_SPACE(token[5])) {
      token += 6;
      material.alpha_texname = token;
      ParseTextureNameAndOption(&(material.alpha_texname),
                                &(material.alpha_texopt), token);
      continue;
    }

    // displacement texture
    if ((0 == strncmp(token, "disp", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.displacement_texname),
                                &(material.displacement_texopt), token);
      continue;
    }

    // reflection map
    if ((0 == strncmp(token, "refl", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.reflection_texname),
                                &(material.reflection_texopt), token);
      continue;
    }

    // PBR: roughness texture
    if ((0 == strncmp(token, "map_Pr", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.roughness_texname),
                                &(material.roughness_texopt), token);
      continue;
    }

    // PBR: metallic texture
    if ((0 == strncmp(token, "map_Pm", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.metallic_texname),
                                &(material.metallic_texopt), token);
      continue;
    }

    // PBR: sheen texture
    if ((0 == strncmp(token, "map_Ps", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.sheen_texname),
                                &(material.sheen_texopt), token);
      continue;
    }

    // PBR: emissive texture
    if ((0 == strncmp(token, "map_Ke", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.emissive_texname),
                                &(material.emissive_texopt), token);
      continue;
    }

    // PBR: normal map texture
    if ((0 == strncmp(token, "norm", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.normal_texname),
                                &(material.normal_texopt), token);
      continue;
    }

    // unknown parameter
    const char *_space = strchr(token, ' ');
    if (!_space) {
      _space = strchr(token, '\t');
    }
    if (_space) {
      std::ptrdiff_t len = _space - token;
      std::string key(token, static_cast<size_t>(len));
      std::string value = _space + 1;
      material.unknown_parameter.insert(
          std::pair<std::string, std::string>(key, value));
    }
  }
  // flush last material.
  material_map->insert(std::pair<std::string, int>(
      material.name, static_cast<int>(materials->size())));
  materials->push_back(material);

  if (warning) {
    (*warning) = warn_ss.str();
  }
}